

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::
emplaceRealloc<slang::ast::StreamingConcatenationExpression::StreamExpression>
          (SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression> *this,
          pointer pos,StreamExpression *args)

{
  ulong uVar1;
  size_type sVar2;
  undefined8 *puVar3;
  Expression *pEVar4;
  pointer pSVar5;
  pointer pSVar6;
  StreamExpression *__cur;
  pointer pSVar7;
  EVP_PKEY_CTX *ctx;
  long lVar8;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar1 = this->cap;
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  lVar8 = (long)pos - (long)this->data_;
  ctx = (EVP_PKEY_CTX *)0x18;
  pSVar5 = (pointer)detail::allocArray(capacity,0x18);
  *(_Optional_payload_base<unsigned_int> *)((long)pSVar5 + lVar8 + 0x10) =
       (args->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>;
  pEVar4 = args->withExpr;
  *(undefined8 *)((long)pSVar5 + lVar8) = (args->operand).ptr;
  ((undefined8 *)((long)pSVar5 + lVar8))[1] = pEVar4;
  pSVar6 = this->data_;
  pSVar7 = pSVar5;
  if (pSVar6 + this->len == pos) {
    for (; pSVar6 != pos; pSVar6 = pSVar6 + 1) {
      (pSVar7->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int> =
           (pSVar6->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>;
      pEVar4 = pSVar6->withExpr;
      (pSVar7->operand).ptr = (pSVar6->operand).ptr;
      pSVar7->withExpr = pEVar4;
      pSVar7 = pSVar7 + 1;
    }
  }
  else {
    for (; pSVar6 != pos; pSVar6 = pSVar6 + 1) {
      (pSVar7->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int> =
           (pSVar6->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>;
      pEVar4 = pSVar6->withExpr;
      (pSVar7->operand).ptr = (pSVar6->operand).ptr;
      pSVar7->withExpr = pEVar4;
      pSVar7 = pSVar7 + 1;
    }
    sVar2 = this->len;
    pSVar6 = this->data_;
    puVar3 = (undefined8 *)((long)pSVar5 + lVar8);
    for (; pos != pSVar6 + sVar2; pos = pos + 1) {
      *(_Optional_payload_base<unsigned_int> *)(puVar3 + 5) =
           (pos->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>;
      pEVar4 = pos->withExpr;
      puVar3[3] = (pos->operand).ptr;
      puVar3[4] = pEVar4;
      puVar3 = puVar3 + 3;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pSVar5;
  return (pointer)((long)pSVar5 + lVar8);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}